

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

SMDiagnostic * __thiscall
llvm::SourceMgr::GetMessage
          (SMDiagnostic *__return_storage_ptr__,SourceMgr *this,SMLoc Loc,DiagKind Kind,Twine *Msg,
          ArrayRef<llvm::SMRange> Ranges,ArrayRef<llvm::SMFixIt> FixIts)

{
  StringRef Msg_00;
  StringRef LineStr_00;
  ArrayRef<std::pair<unsigned_int,_unsigned_int>_> Ranges_00;
  StringRef FN;
  char *__end;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  SMRange *pSVar4;
  char *pcVar5;
  char *extraout_RDX;
  ArrayRef<std::pair<unsigned_int,_unsigned_int>_> local_218;
  char *local_208;
  size_t local_200;
  string local_1f8;
  char *local_1d8;
  size_t local_1d0;
  char *local_1c8;
  char *local_1c0;
  SMLoc local_1b8;
  SourceMgr *local_1b0;
  pair<unsigned_int,_unsigned_int> local_1a8;
  long local_1a0;
  long local_198;
  pair<long,_long> local_190;
  pair<unsigned_int,_unsigned_int> local_180;
  char *local_178;
  char *local_170;
  undefined1 local_168 [8];
  SMRange R;
  uint local_150;
  uint e;
  uint i;
  char *local_128;
  char *BufEnd;
  char *LineEnd;
  char *BufStart;
  char *LineStart;
  MemoryBuffer *local_f8;
  MemoryBuffer *CurMB;
  uint local_e4;
  string local_e0 [4];
  uint CurBuf;
  string LineStr;
  StringRef BufferID;
  pair<unsigned_int,_unsigned_int> LineAndCol;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_4U> ColRanges;
  Twine *Msg_local;
  DiagKind Kind_local;
  SourceMgr *this_local;
  SMLoc Loc_local;
  
  this_local = (SourceMgr *)Loc.Ptr;
  Loc_local.Ptr = (char *)__return_storage_ptr__;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_4U>::SmallVector
            ((SmallVector<std::pair<unsigned_int,_unsigned_int>,_4U> *)&LineAndCol);
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
            ((pair<unsigned_int,_unsigned_int> *)&BufferID.Length);
  LineStr.field_2._8_8_ = anon_var_dwarf_198523;
  BufferID.Data = (char *)strlen("<unknown>");
  std::__cxx11::string::string(local_e0);
  bVar1 = SMLoc::isValid((SMLoc *)&this_local);
  if (bVar1) {
    CurMB = (MemoryBuffer *)this_local;
    local_e4 = FindBufferContainingLoc(this,(SMLoc)this_local);
    if (local_e4 == 0) {
      __assert_fail("CurBuf && \"Invalid or unspecified location!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                    ,0xb5,
                    "SMDiagnostic llvm::SourceMgr::GetMessage(SMLoc, SourceMgr::DiagKind, const Twine &, ArrayRef<SMRange>, ArrayRef<SMFixIt>) const"
                   );
    }
    local_f8 = getMemoryBuffer(this,local_e4);
    iVar2 = (*local_f8->_vptr_MemoryBuffer[2])();
    LineStart = (char *)CONCAT44(extraout_var,iVar2);
    LineStr.field_2._8_8_ = LineStart;
    BufferID.Data = extraout_RDX;
    BufStart = SMLoc::getPointer((SMLoc *)&this_local);
    LineEnd = MemoryBuffer::getBufferStart(local_f8);
    while( true ) {
      bVar1 = false;
      if ((BufStart != LineEnd) && (bVar1 = false, BufStart[-1] != '\n')) {
        bVar1 = BufStart[-1] != '\r';
      }
      if (!bVar1) break;
      BufStart = BufStart + -1;
    }
    BufEnd = SMLoc::getPointer((SMLoc *)&this_local);
    local_128 = MemoryBuffer::getBufferEnd(local_f8);
    pcVar5 = BufStart;
    while( true ) {
      __end = BufEnd;
      bVar1 = false;
      if ((BufEnd != local_128) && (bVar1 = false, *BufEnd != '\n')) {
        bVar1 = *BufEnd != '\r';
      }
      if (!bVar1) break;
      BufEnd = BufEnd + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)&i,pcVar5,__end,(allocator<char> *)((long)&e + 3));
    std::__cxx11::string::operator=(local_e0,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e + 3));
    local_150 = 0;
    sVar3 = ArrayRef<llvm::SMRange>::size(&Ranges);
    R.End.Ptr._4_4_ = (uint)sVar3;
    for (; local_150 != R.End.Ptr._4_4_; local_150 = local_150 + 1) {
      pSVar4 = ArrayRef<llvm::SMRange>::operator[](&Ranges,(ulong)local_150);
      local_168 = (undefined1  [8])(pSVar4->Start).Ptr;
      R.Start.Ptr = (pSVar4->End).Ptr;
      bVar1 = SMRange::isValid((SMRange *)local_168);
      if (((bVar1) && (pcVar5 = SMLoc::getPointer((SMLoc *)local_168), pcVar5 <= BufEnd)) &&
         (pcVar5 = SMLoc::getPointer(&R.Start), BufStart <= pcVar5)) {
        pcVar5 = SMLoc::getPointer((SMLoc *)local_168);
        if (pcVar5 < BufStart) {
          local_170 = (char *)SMLoc::getFromPointer(BufStart);
          local_168 = (undefined1  [8])local_170;
        }
        pcVar5 = SMLoc::getPointer(&R.Start);
        if (BufEnd < pcVar5) {
          local_178 = (char *)SMLoc::getFromPointer(BufEnd);
          R.Start = (SMLoc)local_178;
        }
        pcVar5 = SMLoc::getPointer((SMLoc *)local_168);
        local_198 = (long)pcVar5 - (long)BufStart;
        pcVar5 = SMLoc::getPointer(&R.Start);
        local_1a0 = (long)pcVar5 - (long)BufStart;
        local_190 = std::make_pair<long,long>(&local_198,&local_1a0);
        std::pair<unsigned_int,_unsigned_int>::pair<long,_long,_true>(&local_180,&local_190);
        SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true>::push_back
                  ((SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true> *)
                   &LineAndCol,&local_180);
      }
    }
    local_1b0 = this_local;
    local_1a8 = getLineAndColumn(this,(SMLoc)this_local,local_e4);
    std::pair<unsigned_int,_unsigned_int>::operator=
              ((pair<unsigned_int,_unsigned_int> *)&BufferID.Length,&local_1a8);
  }
  local_1b8.Ptr = (char *)this_local;
  local_1c8 = (char *)LineStr.field_2._8_8_;
  local_1c0 = BufferID.Data;
  Twine::str_abi_cxx11_(&local_1f8,Msg);
  local_1d8 = (char *)std::__cxx11::string::data();
  local_1d0 = std::__cxx11::string::length();
  local_208 = (char *)std::__cxx11::string::data();
  local_200 = std::__cxx11::string::length();
  ArrayRef<std::pair<unsigned_int,_unsigned_int>_>::ArrayRef<void>
            (&local_218,
             (SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void> *)&LineAndCol);
  FN.Length = (size_t)local_1c0;
  FN.Data = local_1c8;
  Msg_00.Length = local_1d0;
  Msg_00.Data = local_1d8;
  LineStr_00.Length = local_200;
  LineStr_00.Data = local_208;
  Ranges_00.Length = local_218.Length;
  Ranges_00.Data = local_218.Data;
  SMDiagnostic::SMDiagnostic
            (__return_storage_ptr__,this,local_1b8,FN,(int)BufferID.Length,
             BufferID.Length._4_4_ + -1,Kind,Msg_00,LineStr_00,Ranges_00,FixIts);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string(local_e0);
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_4U>::~SmallVector
            ((SmallVector<std::pair<unsigned_int,_unsigned_int>,_4U> *)&LineAndCol);
  return __return_storage_ptr__;
}

Assistant:

SMDiagnostic SourceMgr::GetMessage(SMLoc Loc, SourceMgr::DiagKind Kind,
                                   const Twine &Msg,
                                   ArrayRef<SMRange> Ranges,
                                   ArrayRef<SMFixIt> FixIts) const {
  // First thing to do: find the current buffer containing the specified
  // location to pull out the source line.
  SmallVector<std::pair<unsigned, unsigned>, 4> ColRanges;
  std::pair<unsigned, unsigned> LineAndCol;
  StringRef BufferID = "<unknown>";
  std::string LineStr;

  if (Loc.isValid()) {
    unsigned CurBuf = FindBufferContainingLoc(Loc);
    assert(CurBuf && "Invalid or unspecified location!");

    const MemoryBuffer *CurMB = getMemoryBuffer(CurBuf);
    BufferID = CurMB->getBufferIdentifier();

    // Scan backward to find the start of the line.
    const char *LineStart = Loc.getPointer();
    const char *BufStart = CurMB->getBufferStart();
    while (LineStart != BufStart && LineStart[-1] != '\n' &&
           LineStart[-1] != '\r')
      --LineStart;

    // Get the end of the line.
    const char *LineEnd = Loc.getPointer();
    const char *BufEnd = CurMB->getBufferEnd();
    while (LineEnd != BufEnd && LineEnd[0] != '\n' && LineEnd[0] != '\r')
      ++LineEnd;
    LineStr = std::string(LineStart, LineEnd);

    // Convert any ranges to column ranges that only intersect the line of the
    // location.
    for (unsigned i = 0, e = Ranges.size(); i != e; ++i) {
      SMRange R = Ranges[i];
      if (!R.isValid()) continue;

      // If the line doesn't contain any part of the range, then ignore it.
      if (R.Start.getPointer() > LineEnd || R.End.getPointer() < LineStart)
        continue;

      // Ignore pieces of the range that go onto other lines.
      if (R.Start.getPointer() < LineStart)
        R.Start = SMLoc::getFromPointer(LineStart);
      if (R.End.getPointer() > LineEnd)
        R.End = SMLoc::getFromPointer(LineEnd);

      // Translate from SMLoc ranges to column ranges.
      // FIXME: Handle multibyte characters.
      ColRanges.push_back(std::make_pair(R.Start.getPointer()-LineStart,
                                         R.End.getPointer()-LineStart));
    }

    LineAndCol = getLineAndColumn(Loc, CurBuf);
  }

  return SMDiagnostic(*this, Loc, BufferID, LineAndCol.first,
                      LineAndCol.second-1, Kind, Msg.str(),
                      LineStr, ColRanges, FixIts);
}